

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O3

CuboidMedium<pbrt::NanoVDBMediumProvider> *
pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>::Create
          (NanoVDBMediumProvider *provider,ParameterDictionary *parameters,
          Transform *renderFromMedium,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ParsedParameter *pPVar4;
  SpectrumHandle SVar5;
  string preset;
  string local_c0;
  Float local_a0;
  Float local_9c;
  undefined1 local_98 [40];
  SpectrumHandle local_70 [2];
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  paVar1 = &local_c0.field_2;
  local_70[0].
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )0;
  local_98._32_8_ = (ParsedParameter *)0x0;
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  local_70[1].
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )renderFromMedium;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"preset","");
  local_98._0_8_ = local_98 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"");
  ParameterDictionary::GetOneString((string *)local_60,parameters,&local_c0,(string *)local_98);
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,
                    (ulong)((long)&(((string *)local_98._16_8_)->_M_dataplus)._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  if ((ParsedParameter *)local_60._8_8_ != (ParsedParameter *)0x0) {
    bVar2 = GetMediumScatteringProperties
                      ((string *)local_60,local_70,(SpectrumHandle *)(local_98 + 0x20),alloc);
    if (!bVar2) {
      local_c0._M_string_length = 0;
      local_c0.field_2._M_local_buf[0] = '\0';
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      detail::stringPrintfRecursive<std::__cxx11::string&>
                (&local_c0,"Material preset \"%s\" not found.",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      Warning(loc,local_c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,
                        CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                                 local_c0.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  SVar5.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
           )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )local_70[0];
  if (local_70[0].
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits == 0) {
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"sigma_a","");
    local_40._8_8_ = (RGBColorSpace *)0x0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)local_98,(string *)parameters,(SpectrumHandle *)&local_c0,
               (int)&local_40 + 8,(Allocator)0x1);
    SVar5.
    super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
    .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
             )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )local_98._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    if (SVar5.
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
        .bits == 0) {
      iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
      SVar5.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               )(CONCAT44(extraout_var,iVar3) | 0x1000000000000);
      *(undefined4 *)CONCAT44(extraout_var,iVar3) = 0x3f800000;
    }
  }
  pPVar4 = (ParsedParameter *)local_98._32_8_;
  if ((ParsedParameter *)local_98._32_8_ == (ParsedParameter *)0x0) {
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"sigma_s","");
    local_40._M_allocated_capacity = 0;
    ParameterDictionary::GetOneSpectrum
              ((ParameterDictionary *)local_98,(string *)parameters,(SpectrumHandle *)&local_c0,
               (SpectrumType)&local_40,(Allocator)0x1);
    pPVar4 = (ParsedParameter *)local_98._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    if (pPVar4 == (ParsedParameter *)0x0) {
      iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4,4);
      pPVar4 = (ParsedParameter *)(CONCAT44(extraout_var_00,iVar3) | 0x1000000000000);
      *(undefined4 *)CONCAT44(extraout_var_00,iVar3) = 0x3f800000;
    }
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"scale","");
  local_9c = ParameterDictionary::GetOneFloat(parameters,&local_c0,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  local_c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"g","");
  local_a0 = ParameterDictionary::GetOneFloat(parameters,&local_c0,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0._M_dataplus._M_p,
                    CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                             local_c0.field_2._M_local_buf[0]) + 1);
  }
  iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x128,8);
  local_c0._M_dataplus._M_p =
       (pointer)SVar5.
                super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
                .bits;
  local_98._0_8_ = pPVar4;
  CuboidMedium((CuboidMedium<pbrt::NanoVDBMediumProvider> *)CONCAT44(extraout_var_01,iVar3),provider
               ,(SpectrumHandle *)&local_c0,(SpectrumHandle *)local_98,local_9c,local_a0,
               (Transform *)
               local_70[1].
               super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
               .bits,alloc);
  if ((ParsedParameter *)local_60._0_8_ != (ParsedParameter *)(local_60 + 0x10)) {
    operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
  }
  return (CuboidMedium<pbrt::NanoVDBMediumProvider> *)CONCAT44(extraout_var_01,iVar3);
}

Assistant:

static CuboidMedium<Provider> *Create(const Provider *provider,
                                          const ParameterDictionary &parameters,
                                          const Transform &renderFromMedium,
                                          const FileLoc *loc, Allocator alloc) {
        SpectrumHandle sig_a = nullptr, sig_s = nullptr;
        std::string preset = parameters.GetOneString("preset", "");
        if (!preset.empty()) {
            if (!GetMediumScatteringProperties(preset, &sig_a, &sig_s, alloc))
                Warning(loc, "Material preset \"%s\" not found.", preset);
        }

        if (sig_a == nullptr) {
            sig_a = parameters.GetOneSpectrum("sigma_a", nullptr, SpectrumType::Unbounded,
                                              alloc);
            if (sig_a == nullptr)
                sig_a = alloc.new_object<ConstantSpectrum>(1.f);
        }
        if (sig_s == nullptr) {
            sig_s = parameters.GetOneSpectrum("sigma_s", nullptr, SpectrumType::Unbounded,
                                              alloc);
            if (sig_s == nullptr)
                sig_s = alloc.new_object<ConstantSpectrum>(1.f);
        }

        Float sigScale = parameters.GetOneFloat("scale", 1.f);

        Float g = parameters.GetOneFloat("g", 0.0f);

        return alloc.new_object<CuboidMedium<Provider>>(provider, sig_a, sig_s, sigScale,
                                                        g, renderFromMedium, alloc);
    }